

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Record_Query_R_PDU::Encode(Record_Query_R_PDU *this,KDataStream *stream)

{
  uint *puVar1;
  uint *puVar2;
  
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32RqId);
  KDataStream::Write(stream,(this->super_Reliability_Header).m_ui8ReqRelSrv);
  KDataStream::Write(stream,(this->super_Reliability_Header).m_ui8Padding);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16EvntTyp);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Time);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32NumRecs);
  puVar1 = (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    KDataStream::Write<unsigned_int>(stream,*puVar2);
  }
  return;
}

Assistant:

void Record_Query_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << m_ui32RqId
           << m_ui8ReqRelSrv
           << m_ui8Padding
           << m_ui16EvntTyp
           << m_ui32Time
           << m_ui32NumRecs;

    vector<KUINT32>::const_iterator citr = m_vui32RecID.begin();
    vector<KUINT32>::const_iterator citrEnd = m_vui32RecID.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }
}